

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_query_node.cpp
# Opt level: O2

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> __thiscall
duckdb::RecursiveCTENode::Deserialize(RecursiveCTENode *this,Deserializer *deserializer)

{
  RecursiveCTENode *this_00;
  pointer pRVar1;
  _Head_base<0UL,_duckdb::RecursiveCTENode_*,_false> local_20;
  
  this_00 = (RecursiveCTENode *)operator_new(0xe0);
  RecursiveCTENode(this_00);
  local_20._M_head_impl = this_00;
  pRVar1 = unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
           ::operator->((unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,200,"cte_name",&pRVar1->ctename);
  pRVar1 = unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
           ::operator->((unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithExplicitDefault<bool>
            (deserializer,0xc9,"union_all",&pRVar1->union_all,false);
  pRVar1 = unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
           ::operator->((unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>
            (deserializer,0xca,"left",&pRVar1->left);
  pRVar1 = unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
           ::operator->((unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>
            (deserializer,0xcb,"right",&pRVar1->right);
  pRVar1 = unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
           ::operator->((unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,0xcc,"aliases",&pRVar1->aliases);
  pRVar1 = unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
           ::operator->((unique_ptr<duckdb::RecursiveCTENode,_std::default_delete<duckdb::RecursiveCTENode>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            (deserializer,0xcd,"key_targets",&pRVar1->key_targets);
  (this->super_QueryNode)._vptr_QueryNode = (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)this;
}

Assistant:

unique_ptr<QueryNode> RecursiveCTENode::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<RecursiveCTENode>(new RecursiveCTENode());
	deserializer.ReadPropertyWithDefault<string>(200, "cte_name", result->ctename);
	deserializer.ReadPropertyWithExplicitDefault<bool>(201, "union_all", result->union_all, false);
	deserializer.ReadPropertyWithDefault<unique_ptr<QueryNode>>(202, "left", result->left);
	deserializer.ReadPropertyWithDefault<unique_ptr<QueryNode>>(203, "right", result->right);
	deserializer.ReadPropertyWithDefault<vector<string>>(204, "aliases", result->aliases);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(205, "key_targets", result->key_targets);
	return std::move(result);
}